

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

void __thiscall QAbstractSpinBoxPrivate::updateEdit(QAbstractSpinBoxPrivate *this)

{
  char cVar1;
  QWidget *this_00;
  long lVar2;
  long lVar3;
  int length;
  bool bVar4;
  int iVar5;
  P _a;
  long lVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_b8;
  QStringBuilder<QStringBuilder<QString_&,_QString>,_QString_&> local_a0;
  QArrayDataPointer<char16_t> local_78;
  QStringBuilder<QString_&,_QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->type != UnknownType) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    bVar4 = specialValue(this);
    if (bVar4) {
      local_78.d = (this->specialValueText).d.d;
      local_78.ptr = (this->specialValueText).d.ptr;
      local_78.size = (this->specialValueText).d.size;
      if (local_78.d != (Data *)0x0) {
        LOCK();
        ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      (**(code **)(*(long *)&this->super_QWidgetPrivate + 0xd8))(&local_b8,this,&this->value);
      local_58.b.d.size = local_b8.size;
      local_58.b.d.ptr = local_b8.ptr;
      local_58.b.d.d = local_b8.d;
      local_b8.d = (Data *)0x0;
      local_b8.ptr = (char16_t *)0x0;
      local_b8.size = 0;
      local_58.a = &this->prefix;
      QStringBuilder<QString_&,_QString>::QStringBuilder(&local_a0.a,&local_58);
      local_a0.b = &this->suffix;
      QStringBuilder<QStringBuilder<QString_&,_QString>,_QString_&>::convertTo<QString>
                ((QString *)&local_78,&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0.a.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    }
    QLineEdit::displayText((QString *)&local_a0,this->edit);
    bVar4 = ::comparesEqual((QString *)&local_78,(QString *)&local_a0);
    if (bVar4) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
    }
    else {
      cVar1 = this->field_0x3d0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      if (-1 < cVar1) {
        QLineEdit::text((QString *)&local_a0,this->edit);
        lVar3 = CONCAT44(local_a0.a.b.d.ptr._4_4_,(int)local_a0.a.b.d.ptr);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
        iVar5 = QLineEdit::cursorPosition(this->edit);
        QLineEdit::selectedText((QString *)&local_a0,this->edit);
        length = (int)local_a0.a.b.d.ptr;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
        local_58.a = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        QSignalBlocker::QSignalBlocker((QSignalBlocker *)&local_58,(QObject *)this->edit);
        QLineEdit::setText(this->edit,(QString *)&local_78);
        bVar4 = specialValue(this);
        if (!bVar4) {
          lVar2 = (this->prefix).d.size;
          QLineEdit::displayText((QString *)&local_a0,this->edit);
          lVar6 = CONCAT44(local_a0.a.b.d.ptr._4_4_,(int)local_a0.a.b.d.ptr) - (this->suffix).d.size
          ;
          if (iVar5 <= lVar6) {
            lVar6 = (long)iVar5;
          }
          if (lVar6 < lVar2) {
            lVar6 = lVar2;
          }
          iVar5 = (int)lVar6;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
          if (length < 1) {
            if (lVar3 == 0) {
              iVar5 = (int)(this->prefix).d.size;
            }
            QLineEdit::setCursorPosition(this->edit,iVar5);
          }
          else {
            QLineEdit::setSelection(this->edit,iVar5,length);
          }
        }
        QWidget::update(this_00);
        QSignalBlocker::~QSignalBlocker((QSignalBlocker *)&local_58);
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractSpinBoxPrivate::updateEdit()
{
    Q_Q(QAbstractSpinBox);
    if (type == QMetaType::UnknownType)
        return;
    const QString newText = specialValue() ? specialValueText : prefix + textFromValue(value) + suffix;
    if (newText == edit->displayText() || cleared)
        return;

    const bool empty = edit->text().isEmpty();
    int cursor = edit->cursorPosition();
    int selsize = edit->selectedText().size();
    const QSignalBlocker blocker(edit);
    edit->setText(newText);

    if (!specialValue()) {
        cursor = qBound(prefix.size(), cursor, edit->displayText().size() - suffix.size());

        if (selsize > 0) {
            edit->setSelection(cursor, selsize);
        } else {
            edit->setCursorPosition(empty ? prefix.size() : cursor);
        }
    }
    q->update();
}